

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall Render::parseTileset(Render *this,SDL_Surface *_tileset)

{
  bool bVar1;
  SDL_Surface *pSVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int i;
  bool bVar7;
  SDL_Surface **ppSVar8;
  SDL_Surface **ppSVar9;
  ulong uVar10;
  SDL_Rect cut;
  
  ppSVar8 = this->blockBitmap;
  lVar3 = 0;
  do {
    lVar5 = 0;
    ppSVar9 = ppSVar8;
    do {
      cut.y = (int)lVar5;
      cut.w = 0x18;
      cut.h = 0x10;
      cut.x = (int)lVar3 * 0x18;
      pSVar2 = (SDL_Surface *)
               SDL_CreateRGBSurface(0,0x18,0x10,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      *ppSVar9 = pSVar2;
      SDL_UpperBlit(_tileset,&cut,pSVar2,0);
      lVar5 = lVar5 + 0x10;
      ppSVar9 = ppSVar9 + 1;
    } while (lVar5 != 0x80);
    lVar3 = lVar3 + 1;
    ppSVar8 = ppSVar8 + 8;
  } while (lVar3 != 10);
  lVar3 = 0;
  do {
    uVar10 = 0;
    bVar1 = true;
    do {
      bVar7 = bVar1;
      cut.y = ((uint)uVar10 | 0x12) << 3;
      cut.w = 8;
      cut.h = 8;
      cut.x = (int)lVar3 * 8;
      pSVar2 = (SDL_Surface *)
               SDL_CreateRGBSurface(0,8,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      this->ballBitmap[uVar10 | lVar3 * 2] = pSVar2;
      SDL_UpperBlit(_tileset,&cut,pSVar2,0);
      uVar10 = 1;
      bVar1 = false;
    } while (bVar7);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    uVar10 = 0;
    bVar1 = true;
    do {
      bVar6 = bVar1;
      cut.y = ((uint)uVar10 | 0x12) << 3;
      cut.w = 0x30;
      cut.h = 8;
      cut.x = (int)lVar3 * 0x30 + 0x18;
      pSVar2 = (SDL_Surface *)
               SDL_CreateRGBSurface(0,0x30,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      this->paletteBitmap[uVar10 | lVar3 * 2] = pSVar2;
      SDL_UpperBlit(_tileset,&cut,pSVar2,0);
      uVar10 = 1;
      bVar1 = false;
    } while (bVar6);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar7);
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    uVar10 = 0;
    bVar1 = true;
    do {
      bVar6 = bVar1;
      cut.y = ((uint)uVar10 | 0x10) << 3;
      cut.w = 0x60;
      cut.h = 8;
      cut.x = (int)lVar3 * 0x60;
      pSVar2 = (SDL_Surface *)
               SDL_CreateRGBSurface(0,0x60,8,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
      this->paletteBitmap[(uVar10 | lVar3 * 2) + 4] = pSVar2;
      SDL_UpperBlit(_tileset,&cut,pSVar2,0);
      uVar10 = 1;
      bVar1 = false;
    } while (bVar6);
    lVar3 = 1;
    bVar1 = false;
  } while (bVar7);
  iVar4 = 0x78;
  lVar3 = 0;
  do {
    cut.y = 0x90;
    cut.w = 0x10;
    cut.h = 0x10;
    cut.x = iVar4;
    pSVar2 = (SDL_Surface *)
             SDL_CreateRGBSurface(0,0x10,0x10,0x20,0xff0000,0xff00,0xff,0xffffffffff000000);
    this->iconBitmap[lVar3] = pSVar2;
    SDL_UpperBlit(_tileset,&cut,pSVar2,0);
    lVar3 = lVar3 + 1;
    iVar4 = iVar4 + 0x10;
  } while (lVar3 != 8);
  return;
}

Assistant:

void Render::parseTileset(SDL_Surface *_tileset){
    // Get blocks
    for(int i=0; i<10; i++){
        for(int j=0; j<8; j++){
            SDL_Rect cut;
            cut.x = i*BLOCK_W;
            cut.y = j*BLOCK_H;
            cut.w = BLOCK_W;
            cut.h = BLOCK_H;
            blockBitmap[i*8 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, blockBitmap[i*8 + j], nullptr);
        }
    }

    // Get balls
    for(int i=0; i<3; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*BALL_W;
            cut.y = j*BALL_H + 144;
            cut.w = BALL_W;
            cut.h = BALL_H;
            ballBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, ballBitmap[i*2 + j], nullptr);
        }
    }

    // Get small palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_SW + 24;
            cut.y = j*PALETTE_SH + 144;
            cut.w = PALETTE_SW;
            cut.h = PALETTE_SH;
            paletteBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j], nullptr);
        }
    }

    // Get big palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_BW;
            cut.y = j*PALETTE_BH + 128;
            cut.w = PALETTE_BW;
            cut.h = PALETTE_BH;
            paletteBitmap[i*2 + j + 4] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j + 4], nullptr);
        }
    }

    // Get icons
    for(int i=0; i<8; i++){
        SDL_Rect cut;
        cut.x = i*ICON_W + 120;
        cut.y = 144;
        cut.w = ICON_W;
        cut.h = ICON_H;
        iconBitmap[i] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
        SDL_BlitSurface(_tileset, &cut, iconBitmap[i], nullptr);
    }
}